

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonPrettyFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  u32 uVar1;
  long in_FS_OFFSET;
  JsonPretty local_c8;
  undefined1 local_a8 [48];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  size_t sVar2;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8.zIndent = (char *)0x0;
  local_c8.szIndent = 0;
  local_c8.nIndent = 0;
  local_c8.pParse = jsonParseFuncArg(ctx,*argv,0);
  if (local_c8.pParse == (JsonParse *)0x0) goto LAB_001b820b;
  local_c8.pOut = (JsonString *)local_a8;
  local_a8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = local_a8 + 0x22;
  local_a8._16_8_ = 100;
  local_a8._24_8_ = 0;
  local_a8[0x20] = '\x01';
  local_a8[0x21] = '\0';
  local_a8[0x22] = -0x56;
  local_a8[0x23] = -0x56;
  local_a8[0x24] = -0x56;
  local_a8[0x25] = -0x56;
  local_a8[0x26] = -0x56;
  local_a8[0x27] = -0x56;
  local_a8._0_8_ = ctx;
  if (argc == 1) {
LAB_001b81d4:
    local_c8.zIndent = "    ";
    uVar1 = 4;
  }
  else {
    local_c8.zIndent = (char *)sqlite3ValueText(argv[1],'\x01');
    if (local_c8.zIndent == (char *)0x0) goto LAB_001b81d4;
    sVar2 = strlen(local_c8.zIndent);
    uVar1 = (u32)sVar2;
  }
  local_c8.szIndent = uVar1;
  jsonTranslateBlobToPrettyText(&local_c8,0);
  jsonReturnString((JsonString *)local_a8,(JsonParse *)0x0,(sqlite3_context *)0x0);
  jsonParseFree(local_c8.pParse);
LAB_001b820b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonPrettyFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString s;          /* The output string */
  JsonPretty x;          /* Pretty printing context */

  memset(&x, 0, sizeof(x));
  x.pParse = jsonParseFuncArg(ctx, argv[0], 0);
  if( x.pParse==0 ) return;
  x.pOut = &s;
  jsonStringInit(&s, ctx);
  if( argc==1 || (x.zIndent = (const char*)sqlite3_value_text(argv[1]))==0 ){
    x.zIndent = "    ";
    x.szIndent = 4;
  }else{
    x.szIndent = (u32)strlen(x.zIndent);
  }
  jsonTranslateBlobToPrettyText(&x, 0);
  jsonReturnString(&s, 0, 0);
  jsonParseFree(x.pParse);
}